

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O0

Status __thiscall google::protobuf::json_internal::JsonLexer::SkipValue(JsonLexer *this)

{
  bool bVar1;
  Status *x;
  Kind *pKVar2;
  LogMessage *pLVar3;
  anon_class_8_1_8991fb9c in_RSI;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  LogMessageFatal local_130 [21];
  Voidify local_11b [3];
  basic_string_view<char,_std::char_traits<char>_> local_118;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  StatusOr<google::protobuf::json_internal::LocationWith<double>_> local_d8;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  local_a8;
  uint local_40;
  byte local_29;
  StatusOr<google::protobuf::json_internal::JsonLexer::Kind> kind;
  JsonLexer *this_local;
  Status *_status;
  
  PeekKind((JsonLexer *)&stack0xffffffffffffffd8);
  local_29 = 0;
  x = absl::lts_20240722::StatusOr<google::protobuf::json_internal::JsonLexer::Kind>::status
                ((StatusOr<google::protobuf::json_internal::JsonLexer::Kind> *)
                 &stack0xffffffffffffffd8);
  absl::lts_20240722::Status::Status((Status *)this,x);
  bVar1 = absl::lts_20240722::Status::ok((Status *)this);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    local_29 = 1;
  }
  local_40 = (uint)bVar1;
  if ((local_29 & 1) == 0) {
    absl::lts_20240722::Status::~Status((Status *)this);
  }
  if (local_40 == 0) {
    pKVar2 = absl::lts_20240722::StatusOr<google::protobuf::json_internal::JsonLexer::Kind>::
             operator*((StatusOr<google::protobuf::json_internal::JsonLexer::Kind> *)
                       &stack0xffffffffffffffd8);
    switch(*pKVar2) {
    case kObj:
      VisitObject<google::protobuf::json_internal::JsonLexer::SkipValue()::__0>(this,in_RSI);
      local_40 = 1;
      break;
    case kArr:
      VisitArray<google::protobuf::json_internal::JsonLexer::SkipValue()::__1>(this,in_RSI);
      local_40 = 1;
      break;
    case kStr:
      ParseUtf8(&local_a8,in_RSI.this);
      absl::lts_20240722::
      StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::status((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                *)this);
      absl::lts_20240722::
      StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOr(&local_a8);
      local_40 = 1;
      break;
    case kNum:
      ParseNumber(&local_d8,in_RSI.this);
      absl::lts_20240722::StatusOr<google::protobuf::json_internal::LocationWith<double>_>::status
                ((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)this);
      absl::lts_20240722::StatusOr<google::protobuf::json_internal::LocationWith<double>_>::
      ~StatusOr(&local_d8);
      local_40 = 1;
      break;
    case kTrue:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8,"true");
      JsonLocation::SourceLocation::current();
      Expect(this,in_RSI.this,local_e8._M_len,local_e8._M_str);
      local_40 = 1;
      break;
    case kFalse:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_100,"false");
      JsonLocation::SourceLocation::current();
      Expect(this,in_RSI.this,local_100._M_len,local_100._M_str);
      local_40 = 1;
      break;
    case kNull:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_118,"null");
      JsonLocation::SourceLocation::current();
      Expect(this,in_RSI.this,local_118._M_len,local_118._M_str);
      local_40 = 1;
      break;
    default:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_140,"false");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_130,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/json/internal/lexer.cc"
                 ,0xa5,local_140._M_len,local_140._M_str);
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_130)
      ;
      pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar3,(char (*) [12])"unreachable");
      absl::lts_20240722::log_internal::Voidify::operator&&(local_11b,pLVar3);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_130);
    }
  }
  absl::lts_20240722::StatusOr<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOr
            ((StatusOr<google::protobuf::json_internal::JsonLexer::Kind> *)&stack0xffffffffffffffd8)
  ;
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status JsonLexer::SkipValue() {
  absl::StatusOr<Kind> kind = PeekKind();
  RETURN_IF_ERROR(kind.status());

  switch (*kind) {
    case JsonLexer::kObj:
      return VisitObject(
          [this](LocationWith<MaybeOwnedString>&) { return SkipValue(); });
    case JsonLexer::kArr:
      return VisitArray([this] { return SkipValue(); });
    case JsonLexer::kStr:
      return ParseUtf8().status();
    case JsonLexer::kNum:
      return ParseNumber().status();
    case JsonLexer::kTrue:
      return Expect("true");
    case JsonLexer::kFalse:
      return Expect("false");
    case JsonLexer::kNull:
      return Expect("null");
    default:
      break;
  }
  // Some compilers seem to fail to realize this is a basic block
  // terminator and incorrectly believe this function is missing
  // a return.
  ABSL_CHECK(false) << "unreachable";
  return absl::OkStatus();
}